

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerProtection::InitEffect(APowerProtection *this)

{
  TObjPtr<AActor> *obj;
  AActor *pAVar1;
  uint uVar2;
  FSoundID local_1c;
  
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar1 != (AActor *)0x0) {
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    local_1c.ID = (this->super_APowerup).super_AInventory.super_AActor.SeeSound.super_FSoundID.ID;
    S_Sound(pAVar1,0,&local_1c,1.0,0.0);
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    uVar2 = (~(pAVar1->flags3).Value | 0xfbfef9fb) &
            (this->super_APowerup).super_AInventory.super_AActor.flags3.Value;
    (this->super_APowerup).super_AInventory.super_AActor.flags3.Value = uVar2;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    (pAVar1->flags3).Value = (pAVar1->flags3).Value | uVar2 & 0x4010604;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    uVar2 = (~(pAVar1->flags5).Value | 0xfff7bfff) &
            (this->super_APowerup).super_AInventory.super_AActor.flags5.Value;
    (this->super_APowerup).super_AInventory.super_AActor.flags5.Value = uVar2;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    (pAVar1->flags5).Value = (pAVar1->flags5).Value | uVar2 & 0x84000;
  }
  return;
}

Assistant:

void APowerProtection::InitEffect( )
{
	Super::InitEffect();

	if (Owner != NULL)
	{
		S_Sound(Owner, CHAN_AUTO, SeeSound, 1.0f, ATTN_NONE);

		// Transfer various protection flags if owner does not already have them.
		// If the owner already has the flag, clear it from the powerup.
		// If the powerup still has a flag set, add it to the owner.
		flags3 &= ~(Owner->flags3 & PROTECTION_FLAGS3);
		Owner->flags3 |= flags3 & PROTECTION_FLAGS3;

		flags5 &= ~(Owner->flags5 & PROTECTION_FLAGS5);
		Owner->flags5 |= flags5 & PROTECTION_FLAGS5;
	}
}